

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

void handleAbsEvent(_GLFWjoystick *js,int code,int value)

{
  int axis;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int (*paiVar5) [2];
  float fVar6;
  
  axis = (js->linjs).absMap[code];
  if ((code & 0xfffffff8U) == 0x10) {
    uVar4 = code - 0x10U >> 1;
    uVar2 = code & 1;
    paiVar5 = (js->linjs).hats + uVar4;
    if (value == 0) {
      (*paiVar5)[uVar2] = 0;
    }
    else if (value < 0) {
      (*paiVar5)[uVar2] = 1;
    }
    else {
      (*paiVar5)[uVar2] = 2;
    }
    _glfwInputJoystickHat
              (js,axis,handleAbsEvent::stateMap[(*paiVar5)[0]][(js->linjs).hats[uVar4][1]]);
    return;
  }
  iVar1 = (js->linjs).absInfo[code].minimum;
  iVar3 = (js->linjs).absInfo[code].maximum - iVar1;
  if (iVar3 != 0) {
    fVar6 = ((float)value - (float)iVar1) / (float)iVar3;
    _glfwInputJoystickAxis(js,axis,fVar6 + fVar6 + -1.0);
    return;
  }
  js->axes[axis] = (float)value;
  return;
}

Assistant:

static void handleAbsEvent(_GLFWjoystick* js, int code, int value)
{
    const int index = js->linjs.absMap[code];

    if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
    {
        static const char stateMap[3][3] =
        {
            { GLFW_HAT_CENTERED, GLFW_HAT_UP,       GLFW_HAT_DOWN },
            { GLFW_HAT_LEFT,     GLFW_HAT_LEFT_UP,  GLFW_HAT_LEFT_DOWN },
            { GLFW_HAT_RIGHT,    GLFW_HAT_RIGHT_UP, GLFW_HAT_RIGHT_DOWN },
        };

        const int hat = (code - ABS_HAT0X) / 2;
        const int axis = (code - ABS_HAT0X) % 2;
        int* state = js->linjs.hats[hat];

        // NOTE: Looking at several input drivers, it seems all hat events use
        //       -1 for left / up, 0 for centered and 1 for right / down
        if (value == 0)
            state[axis] = 0;
        else if (value < 0)
            state[axis] = 1;
        else if (value > 0)
            state[axis] = 2;

        _glfwInputJoystickHat(js, index, stateMap[state[0]][state[1]]);
    }
    else
    {
        const struct input_absinfo* info = &js->linjs.absInfo[code];
        float normalized = value;

        const int range = info->maximum - info->minimum;
        if (range)
        {
            // Normalize to 0.0 -> 1.0
            normalized = (normalized - info->minimum) / range;
            // Normalize to -1.0 -> 1.0
            normalized = normalized * 2.0f - 1.0f;
        }

        _glfwInputJoystickAxis(js, index, normalized);
    }
}